

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

sqlite3_int64 integerValue(char *zArg)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *zRight;
  long lVar5;
  long lVar6;
  
  cVar1 = *zArg;
  zRight = (byte *)(zArg + ((cVar1 - 0x2bU & 0xfd) == 0));
  bVar2 = *zRight;
  if (bVar2 == 0x30) {
    if (zRight[1] == 0x78) {
      zRight = zRight + 2;
      lVar6 = 0;
      do {
        bVar2 = *zRight;
        iVar3 = (int)(char)bVar2;
        if ((byte)(bVar2 - 0x30) < 10) {
          uVar4 = iVar3 - 0x30;
        }
        else if ((byte)(bVar2 + 0x9f) < 6) {
          uVar4 = iVar3 - 0x57;
        }
        else {
          if (5 < (byte)(bVar2 + 0xbf)) goto LAB_0020a793;
          uVar4 = iVar3 - 0x37;
        }
        if ((int)uVar4 < 0) goto LAB_0020a793;
        lVar6 = lVar6 * 0x10 + (ulong)uVar4;
        zRight = zRight + 1;
      } while( true );
    }
  }
  else if (9 < bVar2 - 0x30) {
    lVar6 = 0;
    goto LAB_0020a793;
  }
  lVar6 = 0;
  do {
    lVar6 = (long)(char)bVar2 + lVar6 * 10 + -0x30;
    bVar2 = zRight[1];
    zRight = zRight + 1;
  } while (bVar2 - 0x30 < 10);
LAB_0020a793:
  lVar5 = 8;
  do {
    iVar3 = duckdb_shell_sqlite3_stricmp
                      (*(char **)((long)&metadata_commands[0x32].match_size + lVar5),(char *)zRight)
    ;
    if (iVar3 == 0) {
      lVar6 = lVar6 * *(int *)((long)&integerValue::aMult[0].zSuffix + lVar5);
      break;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x98);
  lVar5 = -lVar6;
  if (cVar1 != '-') {
    lVar5 = lVar6;
  }
  return lVar5;
}

Assistant:

static sqlite3_int64 integerValue(const char *zArg) {
	sqlite3_int64 v = 0;
	static const struct {
		const char *zSuffix;
		int iMult;
	} aMult[] = {
	    {"KiB", 1024}, {"MiB", 1024 * 1024}, {"GiB", 1024 * 1024 * 1024},
	    {"KB", 1000},  {"MB", 1000000},      {"GB", 1000000000},
	    {"K", 1000},   {"M", 1000000},       {"G", 1000000000},
	};
	int i;
	int isNeg = 0;
	if (zArg[0] == '-') {
		isNeg = 1;
		zArg++;
	} else if (zArg[0] == '+') {
		zArg++;
	}
	if (zArg[0] == '0' && zArg[1] == 'x') {
		int x;
		zArg += 2;
		while ((x = hexDigitValue(zArg[0])) >= 0) {
			v = (v << 4) + x;
			zArg++;
		}
	} else {
		while (IsDigit(zArg[0])) {
			v = v * 10 + zArg[0] - '0';
			zArg++;
		}
	}
	for (i = 0; i < ArraySize(aMult); i++) {
		if (sqlite3_stricmp(aMult[i].zSuffix, zArg) == 0) {
			v *= aMult[i].iMult;
			break;
		}
	}
	return isNeg ? -v : v;
}